

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::GetTargetLinkFlags
          (cmMakefileTargetGenerator *this,string *flags,string *linkLanguage)

{
  pointer *__return_storage_ptr__;
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  string *psVar3;
  string *psVar4;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string local_f8;
  cmAlphaNum local_d8;
  cmAlphaNum local_a8;
  undefined1 local_78 [8];
  string linkFlagsConfig;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *linkLanguage_local;
  string *flags_local;
  cmMakefileTargetGenerator *this_local;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  local_20 = linkLanguage;
  linkLanguage_local = flags;
  flags_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"LINK_FLAGS",&local_41);
  psVar3 = cmGeneratorTarget::GetSafeProperty(pcVar1,&local_40);
  (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
            (pcVar2,flags,psVar3);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  cmAlphaNum::cmAlphaNum(&local_a8,"LINK_FLAGS_");
  __return_storage_ptr__ =
       &opts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  GetConfigName_abi_cxx11_((string *)__return_storage_ptr__,this);
  cmsys::SystemTools::UpperCase(&local_f8,(string *)__return_storage_ptr__);
  cmAlphaNum::cmAlphaNum(&local_d8,&local_f8);
  cmStrCat<>((string *)local_78,&local_a8,&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string
            ((string *)
             &opts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  psVar3 = linkLanguage_local;
  pcVar2 = this->LocalGenerator;
  psVar4 = cmGeneratorTarget::GetSafeProperty
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)local_78);
  (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
            (pcVar2,psVar3,psVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_130);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_150,this);
  cmGeneratorTarget::GetLinkOptions
            (pcVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_130,&local_150,local_20);
  std::__cxx11::string::~string((string *)&local_150);
  cmLocalGenerator::AppendCompileOptions
            ((cmLocalGenerator *)this->LocalGenerator,linkLanguage_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_130,(char *)0x0);
  psVar3 = linkLanguage_local;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  GetConfigName_abi_cxx11_(&local_170,this);
  cmLocalGenerator::AppendPositionIndependentLinkerFlags
            ((cmLocalGenerator *)pcVar2,psVar3,pcVar1,&local_170,local_20);
  std::__cxx11::string::~string((string *)&local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_130);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void cmMakefileTargetGenerator::GetTargetLinkFlags(
  std::string& flags, const std::string& linkLanguage)
{
  this->LocalGenerator->AppendFlags(
    flags, this->GeneratorTarget->GetSafeProperty("LINK_FLAGS"));

  std::string linkFlagsConfig =
    cmStrCat("LINK_FLAGS_", cmSystemTools::UpperCase(this->GetConfigName()));
  this->LocalGenerator->AppendFlags(
    flags, this->GeneratorTarget->GetSafeProperty(linkFlagsConfig));

  std::vector<std::string> opts;
  this->GeneratorTarget->GetLinkOptions(opts, this->GetConfigName(),
                                        linkLanguage);
  // LINK_OPTIONS are escaped.
  this->LocalGenerator->AppendCompileOptions(flags, opts);

  this->LocalGenerator->AppendPositionIndependentLinkerFlags(
    flags, this->GeneratorTarget, this->GetConfigName(), linkLanguage);
}